

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QGate2.cpp
# Opt level: O1

void __thiscall
qclab::qgates::QGate2<std::complex<float>_>::apply
          (QGate2<std::complex<float>_> *this,Op op,int nbQubits,
          vector<std::complex<float>,_std::allocator<std::complex<float>_>_> *vector,int offset)

{
  int iVar1;
  undefined4 in_register_00000084;
  vector<int,_std::allocator<int>_> qubits;
  anon_class_136_17_7d744f41_conflict f;
  undefined1 local_e0 [8];
  void *local_d8;
  int *local_d0 [2];
  long local_c0;
  anon_class_136_17_7d744f41_conflict local_b8;
  
  iVar1 = offset;
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[5])(local_d0,this);
  *local_d0[0] = *local_d0[0] + offset;
  local_d0[0][1] = local_d0[0][1] + offset;
  (*(this->super_QObject<std::complex<float>_>)._vptr_QObject[7])(local_e0,this);
  lambda_QGate2<std::complex<float>>
            (&local_b8,(qgates *)(ulong)(uint)(int)(char)op,(Op)local_e0,
             (SquareMatrix<std::complex<float>_> *)
             (vector->super__Vector_base<std::complex<float>,_std::allocator<std::complex<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start,
             (complex<float> *)CONCAT44(in_register_00000084,iVar1));
  if (local_d8 != (void *)0x0) {
    operator_delete__(local_d8);
  }
  local_d8 = (void *)0x0;
  apply4<qclab::qgates::lambda_QGate2<std::complex<float>>(qclab::Op,qclab::dense::SquareMatrix<std::complex<float>>,std::complex<float>*)::_lambda(unsigned_long,unsigned_long,unsigned_long,unsigned_long)_1_>
            (nbQubits,*local_d0[0],local_d0[0][1],&local_b8);
  if (local_d0[0] != (int *)0x0) {
    operator_delete(local_d0[0],local_c0 - (long)local_d0[0]);
  }
  return;
}

Assistant:

void QGate2< T >::apply( Op op , const int nbQubits ,
                           std::vector< T >& vector , const int offset ) const {
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    auto f = lambda_QGate2( op , this->matrix() , vector.data() ) ;
    apply4( nbQubits , qubits[0] , qubits[1] , f ) ;
  }